

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O1

void __thiscall
llvm::Expected<llvm::DWARFDebugNames::Abbrev>::~Expected
          (Expected<llvm::DWARFDebugNames::Abbrev> *this)

{
  void *pvVar1;
  pointer *__ptr;
  
  if ((this->field_0x20 & 1) == 0) {
    pvVar1 = *(void **)((long)&this->field_0 + 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)&this->field_0 + 0x18) - (long)pvVar1);
      return;
    }
  }
  else {
    if (*(long **)&this->field_0 != (long *)0x0) {
      (**(code **)(**(long **)&this->field_0 + 8))();
    }
    *(undefined8 *)(this->field_0).ErrorStorage.buffer = 0;
  }
  return;
}

Assistant:

~Expected() {
    assertIsChecked();
    if (!HasError)
      getStorage()->~storage_type();
    else
      getErrorStorage()->~error_type();
  }